

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

bool __thiscall
Memory::SegmentBase<Memory::VirtualAllocWrapper>::Initialize
          (SegmentBase<Memory::VirtualAllocWrapper> *this,DWORD allocFlags,bool excludeGuardPages)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  undefined4 *puVar10;
  UINT_PTR UVar11;
  PageAllocatorBaseCommon *pPVar12;
  char *lpAddress;
  AllocatorType *pAVar13;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *pPVar14;
  ulong pageCount;
  
  if (this->address != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x58,"(this->address == nullptr)","this->address == nullptr");
    if (!bVar6) goto LAB_006f824b;
    *puVar10 = 0;
  }
  if ((excludeGuardPages) ||
     ((this->segmentPageCount << 0xc < 0x100001 && ((DAT_01599239 & 1) == 0)))) {
    bVar6 = false;
  }
  else {
    UVar11 = Math::Rand();
    this->leadingGuardPageCount = (int)UVar11 + (int)((UVar11 & 0xffffffff) / 0xf) * -0xf + 1;
    this->trailingGuardPageCount = 1;
    bVar6 = true;
  }
  uVar2 = this->trailingGuardPageCount;
  uVar3 = this->leadingGuardPageCount;
  sVar4 = this->segmentPageCount;
  uVar9 = AutoSystemInfo::GetAllocationGranularityPageCount(&AutoSystemInfo::Data);
  pageCount = -(ulong)uVar9 & ((ulong)uVar9 + uVar3 + sVar4 + (ulong)uVar2) - 1;
  this->segmentPageCount = pageCount - (this->trailingGuardPageCount + this->leadingGuardPageCount);
  pPVar12 = (this->super_SegmentBaseCommon).allocator;
  pAVar13 = &pPVar12[-1].allocatorType;
  if (pPVar12 == (PageAllocatorBaseCommon *)0x0) {
    pAVar13 = (AllocatorType *)0x0;
  }
  if (*(char *)((long)pAVar13 + 0xbe) == '\0') {
    if (*(AllocationPolicyManager **)(pAVar13 + 0x32) != (AllocationPolicyManager *)0x0) {
      bVar7 = AllocationPolicyManager::RequestAlloc
                        (*(AllocationPolicyManager **)(pAVar13 + 0x32),pageCount << 0xc,false);
      if (!bVar7) {
        return false;
      }
      pPVar12 = (this->super_SegmentBaseCommon).allocator;
    }
    pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
               *)&pPVar12[-1].allocatorType;
    if (pPVar12 == (PageAllocatorBaseCommon *)0x0) {
      pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *)0x0;
    }
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::GetVirtualAllocator(pPVar14);
    pPVar12 = (this->super_SegmentBaseCommon).allocator;
    pAVar13 = &pPVar12[-1].allocatorType;
    if (pPVar12 == (PageAllocatorBaseCommon *)0x0) {
      pAVar13 = (AllocatorType *)0x0;
    }
    lpAddress = (char *)VirtualAllocWrapper::AllocPages
                                  ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,(LPVOID)0x0
                                   ,pageCount,allocFlags | 0x2000,4,pAVar13[0x50] == 2);
    this->address = lpAddress;
    if (lpAddress == (char *)0x0) {
      pPVar12 = (this->super_SegmentBaseCommon).allocator;
      pAVar13 = &pPVar12[-1].allocatorType;
      if (pPVar12 == (PageAllocatorBaseCommon *)0x0) {
        pAVar13 = (AllocatorType *)0x0;
      }
      if (*(char *)((long)pAVar13 + 0xbd) == '\x01') {
        *(undefined1 *)((long)pAVar13 + 0xbe) = 1;
      }
      if (*(AllocationPolicyManager **)(pAVar13 + 0x32) != (AllocationPolicyManager *)0x0) {
        AllocationPolicyManager::ReportFailure
                  (*(AllocationPolicyManager **)(pAVar13 + 0x32),pageCount << 0xc);
      }
    }
    else {
      if ((short)lpAddress != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x86,"(((ULONG_PTR)this->address % (64 * 1024)) == 0)",
                           "((ULONG_PTR)this->address % (64 * 1024)) == 0");
        if (!bVar7) {
LAB_006f824b:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar10 = 0;
        lpAddress = this->address;
      }
      if (bVar6) {
        if (DAT_0159923a == 1) {
          Output::Print(L"Number of Leading Guard Pages: %d\n",(ulong)this->leadingGuardPageCount);
        }
        if ((DAT_0159923a & 1) != 0) {
          Output::Print(L"Starting address of Leading Guard Pages: 0x%p\n",this->address);
        }
        if ((DAT_0159923a & 1) != 0) {
          Output::Print(L"Offset of Segment Start address: 0x%p\n",
                        this->address + (this->leadingGuardPageCount << 0xc));
        }
        if ((DAT_0159923a & 1) != 0) {
          Output::Print(L"Starting address of Trailing Guard Pages: 0x%p\n",
                        this->address +
                        ((ulong)this->leadingGuardPageCount + this->segmentPageCount) * 0x1000);
        }
        if ((allocFlags >> 0xc & 1) != 0) {
          pPVar12 = (this->super_SegmentBaseCommon).allocator;
          pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                     *)&pPVar12[-1].allocatorType;
          if (pPVar12 == (PageAllocatorBaseCommon *)0x0) {
            pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       *)0x0;
          }
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::GetVirtualAllocator(pPVar14);
          VirtualAllocWrapper::Free
                    ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,this->address,
                     (ulong)(this->leadingGuardPageCount << 0xc),0x4000);
          pPVar12 = (this->super_SegmentBaseCommon).allocator;
          pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                     *)&pPVar12[-1].allocatorType;
          if (pPVar12 == (PageAllocatorBaseCommon *)0x0) {
            pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       *)0x0;
          }
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::GetVirtualAllocator(pPVar14);
          VirtualAllocWrapper::Free
                    ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,
                     this->address +
                     ((ulong)this->leadingGuardPageCount + this->segmentPageCount) * 0x1000,
                     (ulong)(this->trailingGuardPageCount << 0xc),0x4000);
        }
        pPVar12 = (this->super_SegmentBaseCommon).allocator;
        pAVar13 = &pPVar12[-1].allocatorType;
        if (pPVar12 == (PageAllocatorBaseCommon *)0x0) {
          pAVar13 = (AllocatorType *)0x0;
        }
        if (*(AllocationPolicyManager **)(pAVar13 + 0x32) != (AllocationPolicyManager *)0x0) {
          AllocationPolicyManager::ReportFree
                    (*(AllocationPolicyManager **)(pAVar13 + 0x32),
                     (ulong)((this->trailingGuardPageCount + this->leadingGuardPageCount) * 0x1000))
          ;
        }
        this->address = this->address + (this->leadingGuardPageCount << 0xc);
      }
      pPVar12 = (this->super_SegmentBaseCommon).allocator;
      pAVar13 = &pPVar12[-1].allocatorType;
      if (pPVar12 == (PageAllocatorBaseCommon *)0x0) {
        pAVar13 = (AllocatorType *)0x0;
      }
      cVar8 = (**(code **)(*(long *)pAVar13 + 0x30))
                        (pAVar13,this,allocFlags >> 0xc & 1,&this->secondaryAllocator);
      if ((cVar8 != '\0') &&
         (((DAT_015bf41c == '\x01' && ((this->field_0x2c & 2) == 0)) ||
          (bVar6 = RecyclerWriteBarrierManager::OnSegmentAlloc(this->address,this->segmentPageCount)
          , bVar6)))) {
        bVar1 = this->field_0x2c;
        this->field_0x2c = bVar1 | 1;
        if ((bVar1 & 2) == 0) {
          return true;
        }
        RecyclerWriteBarrierManager::ToggleBarrier(this->address,this->segmentPageCount << 0xc,true)
        ;
        return true;
      }
      pPVar12 = (this->super_SegmentBaseCommon).allocator;
      pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *)&pPVar12[-1].allocatorType;
      if (pPVar12 == (PageAllocatorBaseCommon *)0x0) {
        pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   *)0x0;
      }
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::GetVirtualAllocator(pPVar14);
      VirtualAllocWrapper::Free
                ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,lpAddress,
                 this->segmentPageCount << 0xc,0x8000);
      pPVar12 = (this->super_SegmentBaseCommon).allocator;
      sVar4 = this->segmentPageCount;
      pAVar13 = &pPVar12[-1].allocatorType;
      if (pPVar12 == (PageAllocatorBaseCommon *)0x0) {
        pAVar13 = (AllocatorType *)0x0;
      }
      if (*(char *)((long)pAVar13 + 0xbd) == '\x01') {
        *(undefined1 *)((long)pAVar13 + 0xbe) = 1;
      }
      if (*(AllocationPolicyManager **)(pAVar13 + 0x32) != (AllocationPolicyManager *)0x0) {
        AllocationPolicyManager::ReportFailure
                  (*(AllocationPolicyManager **)(pAVar13 + 0x32),sVar4 << 0xc);
      }
      this->address = (char *)0x0;
    }
  }
  return false;
}

Assistant:

bool
SegmentBase<T>::Initialize(DWORD allocFlags, bool excludeGuardPages)
{
    Assert(this->address == nullptr);
    char* originalAddress = nullptr;
    bool addGuardPages = false;
    if (!excludeGuardPages)
    {
        addGuardPages = (this->segmentPageCount * AutoSystemInfo::PageSize) > VirtualAllocThreshold;
#if TARGET_32
        unsigned int randomNumber2 = static_cast<unsigned int>(Math::Rand());
        addGuardPages = addGuardPages && (randomNumber2 % 4 == 1);
#endif
#if DEBUG
        addGuardPages = addGuardPages || Js::Configuration::Global.flags.ForceGuardPages;
#endif
        if (addGuardPages)
        {
            unsigned int randomNumber = static_cast<unsigned int>(Math::Rand());
            this->leadingGuardPageCount = randomNumber % maxGuardPages + minGuardPages;
            this->trailingGuardPageCount = minGuardPages;
        }
    }

    // We can only allocate with this granularity using VirtualAlloc
    size_t totalPages = Math::Align<size_t>(this->segmentPageCount + leadingGuardPageCount + trailingGuardPageCount, AutoSystemInfo::Data.GetAllocationGranularityPageCount());
    this->segmentPageCount = totalPages - (leadingGuardPageCount + trailingGuardPageCount);

#ifdef FAULT_INJECTION
    if (Js::FaultInjection::Global.ShouldInjectFault(Js::FaultInjection::Global.NoThrow))
    {
        this->address = nullptr;
        return false;
    }
#endif

    if (!this->GetAllocator()->RequestAlloc(totalPages * AutoSystemInfo::PageSize))
    {
        return false;
    }

    this->address = (char *)GetAllocator()->GetVirtualAllocator()->AllocPages(NULL, totalPages, MEM_RESERVE | allocFlags, PAGE_READWRITE, this->IsInCustomHeapAllocator());

    if (this->address == nullptr)
    {
        this->GetAllocator()->ReportFailure(totalPages * AutoSystemInfo::PageSize);
        return false;
    }

    Assert( ((ULONG_PTR)this->address % (64 * 1024)) == 0 );

    originalAddress = this->address;
    bool committed = (allocFlags & MEM_COMMIT) != 0;
    if (addGuardPages)
    {
#if DBG_DUMP
        GUARD_PAGE_TRACE(_u("Number of Leading Guard Pages: %d\n"), leadingGuardPageCount);
        GUARD_PAGE_TRACE(_u("Starting address of Leading Guard Pages: 0x%p\n"), address);
        GUARD_PAGE_TRACE(_u("Offset of Segment Start address: 0x%p\n"), this->address + (leadingGuardPageCount*AutoSystemInfo::PageSize));
        GUARD_PAGE_TRACE(_u("Starting address of Trailing Guard Pages: 0x%p\n"), address + ((leadingGuardPageCount + this->segmentPageCount)*AutoSystemInfo::PageSize));
#endif
        if (committed)
        {
            GetAllocator()->GetVirtualAllocator()->Free(address,
              leadingGuardPageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);

            GetAllocator()->GetVirtualAllocator()->Free(address +
              ((leadingGuardPageCount + this->segmentPageCount) * AutoSystemInfo::PageSize),
              trailingGuardPageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
        }
        this->GetAllocator()->ReportFree((leadingGuardPageCount + trailingGuardPageCount) * AutoSystemInfo::PageSize);

        this->address = this->address + (leadingGuardPageCount*AutoSystemInfo::PageSize);
    }

    if (!GetAllocator()->CreateSecondaryAllocator(this, committed, &this->secondaryAllocator))
    {
        GetAllocator()->GetVirtualAllocator()->Free(originalAddress,
          GetPageCount() * AutoSystemInfo::PageSize, MEM_RELEASE);
        this->GetAllocator()->ReportFailure(GetPageCount() * AutoSystemInfo::PageSize);
        this->address = nullptr;
        return false;
    }

#ifdef RECYCLER_WRITE_BARRIER
#if defined(TARGET_64) && defined(RECYCLER_WRITE_BARRIER_BYTE)
    bool registerBarrierResult = true;
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (CONFIG_FLAG(StrictWriteBarrierCheck))
    {
        if (this->isWriteBarrierEnabled)
        {
            // only commit card table for write barrier pages for strict check
            // we can do this in free build if all write barrier annotated struct
            // only allocate with write barrier pages
            registerBarrierResult = RecyclerWriteBarrierManager::OnSegmentAlloc(this->address, this->segmentPageCount);
        }
    }
    else
#endif
    {
        registerBarrierResult = RecyclerWriteBarrierManager::OnSegmentAlloc(this->address, this->segmentPageCount);
    }

    if (!registerBarrierResult)
    {
        GetAllocator()->GetVirtualAllocator()->Free(originalAddress,
          GetPageCount() * AutoSystemInfo::PageSize, MEM_RELEASE);
        this->GetAllocator()->ReportFailure(GetPageCount() * AutoSystemInfo::PageSize);
        this->address = nullptr;
        return false;
    }
#endif

    this->isWriteBarrierAllowed = true;
#if DBG

    if (this->isWriteBarrierEnabled)
    {
        RecyclerWriteBarrierManager::ToggleBarrier(this->address,
          this->segmentPageCount * AutoSystemInfo::PageSize, true);
    }
#endif
#endif

    return true;
}